

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sink.h
# Opt level: O0

void __thiscall spdlog::sinks::sink::sink(sink *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__sink_003123a0;
  std::atomic<int>::atomic((atomic<int> *)this,(__integral_type)((ulong)in_RDI >> 0x20));
  return;
}

Assistant:

class SPDLOG_API sink {
public:
    virtual ~sink() = default;
    virtual void log(const details::log_msg &msg) = 0;
    virtual void flush() = 0;
    virtual void set_pattern(const std::string &pattern) = 0;
    virtual void set_formatter(std::unique_ptr<spdlog::formatter> sink_formatter) = 0;

    void set_level(level::level_enum log_level);
    level::level_enum level() const;
    bool should_log(level::level_enum msg_level) const;

protected:
    // sink log level - default is all
    level_t level_{level::trace};
}